

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

uint mwDrop_(uint kb,int type,int silent)

{
  mwGrabData *pmVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  mwGrabData *__ptr;
  mwGrabData *pmVar6;
  
  uVar5 = 0;
  if (kb != 0 || mwGrabList != (mwGrabData *)0x0) {
    uVar5 = 60000;
    if (kb != 0) {
      uVar5 = kb;
    }
    pcVar2 = "no-mans-land";
    if (type == 0xfb) {
      pcVar2 = "grabbed";
    }
    pmVar6 = (mwGrabData *)0x0;
    __ptr = mwGrabList;
    uVar4 = uVar5;
    do {
      if (__ptr == (mwGrabData *)0x0) {
        uVar5 = uVar5 - uVar4;
        if (silent != 0 || uVar5 == 0) {
          return uVar5;
        }
        mwWrite("dropped: all %s memory (%u kb)\n",pcVar2,(ulong)uVar5);
        goto LAB_0010892e;
      }
      if (__ptr->type == type) {
        pmVar1 = __ptr->next;
        if (pmVar6 != (mwGrabData *)0x0) {
          pmVar6->next = pmVar1;
        }
        if (mwGrabList == __ptr) {
          mwGrabList = pmVar1;
        }
        uVar4 = uVar4 - 1;
        lVar3 = 0xc;
        do {
          if (__ptr->blob[lVar3 + -0xc] != (char)type) {
            mwWrite("wild pointer: <%ld> %s memory hit at %p\n",mwCounter,pcVar2,
                    __ptr->blob + lVar3 + -0xc);
            mwFlush();
            break;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 0x400);
        mwGrabSize = mwGrabSize + -0x400;
        free(__ptr);
        __ptr = pmVar1;
      }
      else {
        pmVar6 = __ptr;
        __ptr = __ptr->next;
      }
    } while (uVar4 != 0);
    if (silent == 0) {
      mwWrite("dropped: %u kilobytes of %s memory\n",(ulong)uVar5,pcVar2);
LAB_0010892e:
      mwFlush();
    }
  }
  return uVar5;
}

Assistant:

static unsigned mwDrop_(unsigned kb, int type, int silent)
{
	unsigned i = kb;
	mwGrabData *gd, *tmp, *pr;
	const void *p;

	if (mwGrabList == NULL && kb == 0) {
		return 0;
	}
	if (!kb) {
		i = kb = 60000U;
	}

	pr = NULL;
	gd = mwGrabList;
	for (; kb;) {
		if (gd == NULL) {
			if (i - kb > 0 && !silent) {
				mwWrite("dropped: all %s memory (%u kb)\n", mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		if (gd->type == type) {
			if (pr) {
				pr->next = gd->next;
			}
			kb --;
			tmp = gd;
			if (mwGrabList == gd) {
				mwGrabList = gd->next;
			}
			gd = gd->next;
			p = mwTestMem(tmp->blob, sizeof(tmp->blob), type);
			if (p != NULL) {
				mwWrite("wild pointer: <%ld> %s memory hit at %p\n",
						mwCounter, mwGrabType(type), p);
				FLUSH();
			}
			mwGrabSize -= (long) sizeof(mwGrabData);
			free(tmp);
		} else {
			pr = gd;
			gd = gd->next;
		}
	}
	if (!silent) {
		mwWrite("dropped: %u kilobytes of %s memory\n", i, mwGrabType(type));
		FLUSH();
	}
	return i;
}